

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool deqp::gles2::Functional::typeContainsMatchingBasicType
               (VarType *type,dataTypePredicate predicate)

{
  StructType *pSVar1;
  pointer pSVar2;
  bool bVar3;
  VarType *type_00;
  long lVar4;
  long lVar5;
  long lVar6;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type == TYPE_BASIC) {
    bVar3 = (*predicate)((type->m_data).basic.type);
    return bVar3;
  }
  pSVar1 = (type->m_data).structPtr;
  lVar6 = 0x20;
  lVar5 = -1;
  do {
    pSVar2 = (pSVar1->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(int)(((long)(pSVar1->m_members).
                               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38);
    lVar5 = lVar5 + 1;
    if (lVar4 <= lVar5) break;
    type_00 = (VarType *)((long)&(pSVar2->m_name)._M_dataplus._M_p + lVar6);
    lVar6 = lVar6 + 0x38;
    bVar3 = typeContainsMatchingBasicType(type_00,predicate);
  } while (!bVar3);
  return lVar5 < lVar4;
}

Assistant:

static bool typeContainsMatchingBasicType (const glu::VarType& type, const dataTypePredicate predicate)
{
	if (type.isBasicType())
		return predicate(type.getBasicType());
	else if (type.isArrayType())
		return typeContainsMatchingBasicType(type.getElementType(), predicate);
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			if (typeContainsMatchingBasicType(structType.getMember(i).getType(), predicate))
				return true;
		return false;
	}
}